

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInnerProductDynamicQuantizationConversionParameterValidation(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  QuantizationParams *pQVar4;
  LinearQuantizationParams *pLVar5;
  ostream *poVar6;
  LookUpTableQuantizationParams *this;
  Result local_1d8;
  undefined1 local_1a8 [4];
  int i;
  undefined1 local_158 [80];
  undefined1 local_108 [84];
  undefined4 local_b4;
  Result local_b0;
  WeightParams *weights;
  InnerProductLayerParams *inner_product_params;
  NeuralNetworkLayer *layer1;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  NeuralNetwork *local_48;
  NeuralNetwork *nnWrite;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&nnWrite);
  local_48 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&nnWrite);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(local_48,EXACT_ARRAY_MAPPING);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&nnWrite);
  shape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)shape,"A");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)shape);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)shape);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&nnWrite);
  layer1 = (NeuralNetworkLayer *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)layer1,"B");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)layer1);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  inner_product_params =
       (InnerProductLayerParams *)CoreML::Specification::NeuralNetwork::add_layers(local_48);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)inner_product_params,"inner_product");
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)inner_product_params,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)inner_product_params,"B");
  weights = (WeightParams *)
            CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                      ((NeuralNetworkLayer *)inner_product_params);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels
            ((InnerProductLayerParams *)weights,4);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels
            ((InnerProductLayerParams *)weights,2);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)weights,false);
  CoreML::Specification::InnerProductLayerParams::set_int8dynamicquantize
            ((InnerProductLayerParams *)weights,true);
  local_b0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::InnerProductLayerParams::mutable_weights
                 ((InnerProductLayerParams *)weights);
  CoreML::Specification::WeightParams::set_int8rawvalue
            ((WeightParams *)local_b0.m_message._M_storage._M_storage,"11111111");
  pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                     ((WeightParams *)local_b0.m_message._M_storage._M_storage);
  CoreML::Specification::QuantizationParams::set_numberofbits(pQVar4,8);
  pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                     ((WeightParams *)local_b0.m_message._M_storage._M_storage);
  pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
  CoreML::Specification::LinearQuantizationParams::add_scale(pLVar5,4.0);
  CoreML::validate<(MLModelType)500>(&local_b0,(Model *)&nnWrite);
  bVar1 = CoreML::Result::good(&local_b0);
  if (bVar1) {
    CoreML::Specification::InnerProductLayerParams::set_hasbias
              ((InnerProductLayerParams *)weights,true);
    CoreML::validate<(MLModelType)500>((Result *)(local_108 + 0x28),(Model *)&nnWrite);
    CoreML::Result::operator=(&local_b0,(Result *)(local_108 + 0x28));
    CoreML::Result::~Result((Result *)(local_108 + 0x28));
    bVar1 = CoreML::Result::good(&local_b0);
    if (bVar1) {
      CoreML::Specification::InnerProductLayerParams::set_hasbias
                ((InnerProductLayerParams *)weights,false);
      pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                         ((WeightParams *)local_b0.m_message._M_storage._M_storage);
      pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar5,1.0);
      CoreML::validate<(MLModelType)500>((Result *)local_108,(Model *)&nnWrite);
      CoreML::Result::operator=(&local_b0,(Result *)local_108);
      CoreML::Result::~Result((Result *)local_108);
      bVar1 = CoreML::Result::good(&local_b0);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x283);
        poVar6 = std::operator<<(poVar6,": error: ");
        poVar6 = std::operator<<(poVar6,"!((res).good())");
        poVar6 = std::operator<<(poVar6," was false, expected true.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
      else {
        pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                           ((WeightParams *)local_b0.m_message._M_storage._M_storage);
        pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
        CoreML::Specification::LinearQuantizationParams::clear_bias(pLVar5);
        pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                           ((WeightParams *)local_b0.m_message._M_storage._M_storage);
        CoreML::Specification::QuantizationParams::set_numberofbits(pQVar4,7);
        CoreML::validate<(MLModelType)500>((Result *)(local_158 + 0x28),(Model *)&nnWrite);
        CoreML::Result::operator=(&local_b0,(Result *)(local_158 + 0x28));
        CoreML::Result::~Result((Result *)(local_158 + 0x28));
        bVar1 = CoreML::Result::good(&local_b0);
        if (bVar1) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar6 = std::operator<<(poVar6,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x289);
          poVar6 = std::operator<<(poVar6,": error: ");
          poVar6 = std::operator<<(poVar6,"!((res).good())");
          poVar6 = std::operator<<(poVar6," was false, expected true.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
        }
        else {
          pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                             ((WeightParams *)local_b0.m_message._M_storage._M_storage);
          CoreML::Specification::QuantizationParams::set_numberofbits(pQVar4,8);
          pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                             ((WeightParams *)local_b0.m_message._M_storage._M_storage);
          this = CoreML::Specification::QuantizationParams::mutable_lookuptablequantization(pQVar4);
          CoreML::Specification::LookUpTableQuantizationParams::add_floatvalue(this,1.0);
          CoreML::validate<(MLModelType)500>((Result *)local_158,(Model *)&nnWrite);
          CoreML::Result::operator=(&local_b0,(Result *)local_158);
          CoreML::Result::~Result((Result *)local_158);
          bVar1 = CoreML::Result::good(&local_b0);
          if (bVar1) {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,":");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x28f);
            poVar6 = std::operator<<(poVar6,": error: ");
            poVar6 = std::operator<<(poVar6,"!((res).good())");
            poVar6 = std::operator<<(poVar6," was false, expected true.");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            m1._oneof_case_[0] = 1;
          }
          else {
            pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                               ((WeightParams *)local_b0.m_message._M_storage._M_storage);
            pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
            CoreML::Specification::LinearQuantizationParams::add_scale(pLVar5,4.0);
            CoreML::Specification::WeightParams::clear_int8rawvalue
                      ((WeightParams *)local_b0.m_message._M_storage._M_storage);
            CoreML::Specification::WeightParams::set_rawvalue
                      ((WeightParams *)local_b0.m_message._M_storage._M_storage,"11111111");
            CoreML::validate<(MLModelType)500>((Result *)&stack0xfffffffffffffe80,(Model *)&nnWrite)
            ;
            CoreML::Result::operator=(&local_b0,(Result *)&stack0xfffffffffffffe80);
            CoreML::Result::~Result((Result *)&stack0xfffffffffffffe80);
            bVar1 = CoreML::Result::good(&local_b0);
            if (bVar1) {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar6 = std::operator<<(poVar6,":");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x296);
              poVar6 = std::operator<<(poVar6,": error: ");
              poVar6 = std::operator<<(poVar6,"!((res).good())");
              poVar6 = std::operator<<(poVar6," was false, expected true.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              m1._oneof_case_[0] = 1;
            }
            else {
              CoreML::Specification::WeightParams::clear_rawvalue
                        ((WeightParams *)local_b0.m_message._M_storage._M_storage);
              CoreML::Specification::WeightParams::set_float16value
                        ((WeightParams *)local_b0.m_message._M_storage._M_storage,"0101010101010101"
                        );
              CoreML::validate<(MLModelType)500>((Result *)local_1a8,(Model *)&nnWrite);
              CoreML::Result::operator=(&local_b0,(Result *)local_1a8);
              CoreML::Result::~Result((Result *)local_1a8);
              bVar1 = CoreML::Result::good(&local_b0);
              if (bVar1) {
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar6 = std::operator<<(poVar6,":");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x29c);
                poVar6 = std::operator<<(poVar6,": error: ");
                poVar6 = std::operator<<(poVar6,"!((res).good())");
                poVar6 = std::operator<<(poVar6," was false, expected true.");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                m1._oneof_case_[0] = 1;
              }
              else {
                CoreML::Specification::WeightParams::clear_float16value
                          ((WeightParams *)local_b0.m_message._M_storage._M_storage);
                local_1d8.m_message._M_storage._M_storage[4] = '\0';
                local_1d8.m_message._M_storage._M_storage[5] = '\0';
                local_1d8.m_message._M_storage._M_storage[6] = '\0';
                local_1d8.m_message._M_storage._M_storage[7] = '\0';
                for (; (int)local_1d8.m_message._M_storage._M_storage._4_4_ < 8;
                    local_1d8.m_message._M_storage._M_storage._4_4_ =
                         local_1d8.m_message._M_storage._M_storage._4_4_ + 1) {
                  CoreML::Specification::WeightParams::add_floatvalue
                            ((WeightParams *)local_b0.m_message._M_storage._M_storage,1.0);
                }
                CoreML::validate<(MLModelType)500>(&local_1d8,(Model *)&nnWrite);
                CoreML::Result::operator=(&local_b0,&local_1d8);
                CoreML::Result::~Result(&local_1d8);
                bVar1 = CoreML::Result::good(&local_b0);
                if (bVar1) {
                  poVar6 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                          );
                  poVar6 = std::operator<<(poVar6,":");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2a4);
                  poVar6 = std::operator<<(poVar6,": error: ");
                  poVar6 = std::operator<<(poVar6,"!((res).good())");
                  poVar6 = std::operator<<(poVar6," was false, expected true.");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  m1._oneof_case_[0] = 1;
                }
                else {
                  CoreML::Specification::WeightParams::clear_floatvalue
                            ((WeightParams *)local_b0.m_message._M_storage._M_storage);
                  m1._oneof_case_[0] = 0;
                }
              }
            }
          }
        }
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x27d);
      poVar6 = std::operator<<(poVar6,": error: ");
      poVar6 = std::operator<<(poVar6,"(res).good()");
      poVar6 = std::operator<<(poVar6," was false, expected true.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x278);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  local_b4 = 1;
  CoreML::Result::~Result(&local_b0);
  CoreML::Specification::Model::~Model((Model *)&nnWrite);
  return m1._oneof_case_[0];
}

Assistant:

int testInnerProductDynamicQuantizationConversionParameterValidation() {

    // Setup
    Specification::Model m1;
    Specification::NeuralNetwork *nnWrite = m1.mutable_neuralnetwork();
    nnWrite->set_arrayinputshapemapping(Specification::EXACT_ARRAY_MAPPING);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Specification::NeuralNetworkLayer* layer1 = nnWrite->add_layers();
    layer1->set_name("inner_product");
    layer1->add_input("A");
    layer1->add_output("B");
    Specification::InnerProductLayerParams* inner_product_params = layer1->mutable_innerproduct();
    inner_product_params->set_inputchannels(4);
    inner_product_params->set_outputchannels(2);
    inner_product_params->set_hasbias(false);
    inner_product_params->set_int8dynamicquantize(true);

    auto* weights = inner_product_params->mutable_weights();
    weights->set_int8rawvalue("11111111");
    weights->mutable_quantization()->set_numberofbits(8);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Setup: Correct model
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Case 1: has bias
    inner_product_params->set_hasbias(true);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    inner_product_params->set_hasbias(false);

    // Case 2: Non empty linear quantization bias
    weights->mutable_quantization()->mutable_linearquantization()->add_bias(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->clear_bias();

    // Case 3: numberofbits != 8
    weights->mutable_quantization()->set_numberofbits(7);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->set_numberofbits(8);

    // Case 4: Lookup table mode is on
    weights->mutable_quantization()->mutable_lookuptablequantization()->add_floatvalue(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Case 5: uint8 weights
    weights->clear_int8rawvalue();
    weights->set_rawvalue("11111111");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_rawvalue();

    // Case 6: float16 weights
    weights->set_float16value("0101010101010101");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_float16value();

    // Case 7: float weights
    for (int i = 0; i < 8; ++i){
        weights->add_floatvalue(1);
    }
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_floatvalue();

    return 0;
}